

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool is_ASCII_name(char *hostname)

{
  byte bVar1;
  byte *local_20;
  uchar *ch;
  char *hostname_local;
  
  local_20 = (byte *)hostname;
  do {
    if (*local_20 == 0) {
      return true;
    }
    bVar1 = *local_20;
    local_20 = local_20 + 1;
  } while ((bVar1 & 0x80) == 0);
  return false;
}

Assistant:

static bool is_ASCII_name(const char *hostname)
{
  const unsigned char *ch = (const unsigned char *)hostname;

  while(*ch) {
    if(*ch++ & 0x80)
      return FALSE;
  }
  return TRUE;
}